

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline::getPipelinedCap
          (RpcPipeline *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  size_t sVar1;
  long lVar2;
  Entry *pEVar3;
  size_t in_RCX;
  long lVar4;
  PipelineOp *pPVar5;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar6;
  Own<capnp::ClientHook,_std::nullptr_t> OVar7;
  Array<capnp::PipelineOp> result;
  Array<capnp::PipelineOp> local_88;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 *local_50;
  anon_class_16_2_633b9ddf local_40;
  StringPtr local_30;
  
  local_88.ptr = (PipelineOp *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (8,0,in_RCX,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_50 = &kj::_::HeapArrayDisposer::instance;
  pPVar5 = local_88.ptr;
  if (in_RCX != 0) {
    lVar2 = 0;
    do {
      lVar4 = lVar2;
      *(undefined8 *)((long)&(local_88.ptr)->type + lVar4) = *(undefined8 *)(ops.size_ + lVar4);
      lVar2 = lVar4 + 8;
    } while (in_RCX << 3 != lVar4 + 8);
    pPVar5 = (PipelineOp *)((long)&local_88.ptr[1].type + lVar4);
  }
  local_88.size_ = (long)pPVar5 - (long)local_88.ptr >> 3;
  local_88.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  local_40.this = (RpcPipeline *)ops.ptr;
  local_40.ops = &local_88;
  local_30.content.ptr = (char *)local_88.ptr;
  local_30.content.size_ = local_88.size_;
  pEVar3 = kj::
           Table<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Entry,kj::HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>>
           ::
           FindOrCreateImpl<capnp::_::RpcSystemBase::RpcConnectionState::RpcPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::{lambda()#1},kj::ArrayPtr<capnp::PipelineOp>&>
           ::apply<0ul>(&(((RpcPipeline *)ops.ptr)->clientMap).table,&local_30,&local_40);
  (*((pEVar3->value).ptr)->_vptr_ClientHook[4])(this);
  sVar1 = local_88.size_;
  pPVar5 = local_88.ptr;
  pCVar6 = extraout_RDX;
  if (local_88.ptr != (PipelineOp *)0x0) {
    local_88.ptr = (PipelineOp *)0x0;
    local_88.size_ = 0;
    (**(local_88.disposer)->_vptr_ArrayDisposer)(local_88.disposer,pPVar5,8,sVar1,sVar1,0);
    pCVar6 = extraout_RDX_00;
  }
  OVar7.ptr = pCVar6;
  OVar7.disposer = (Disposer *)this;
  return OVar7;
}

Assistant:

kj::Own<ClientHook> getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) override {
      auto copy = kj::heapArrayBuilder<PipelineOp>(ops.size());
      for (auto& op: ops) {
        copy.add(op);
      }
      return getPipelinedCap(copy.finish());
    }